

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

bool __thiscall QPDF::read_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte *pbVar11;
  qpdf_offset_t qVar12;
  int iVar13;
  byte *pbVar14;
  array<char,_21UL> line;
  byte local_3d;
  byte local_3c [19];
  undefined1 local_29;
  
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  pbVar14 = &local_3d;
  lVar4 = (**(code **)(*plVar1 + 0x38))(plVar1,pbVar14,0x14);
  uVar6 = 0;
  if (lVar4 == 0x14) {
    local_29 = 0;
    if (local_3d == 0x30) {
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        uVar6 = uVar5 + 1;
      } while (local_3c[uVar5] == 0x30);
      pbVar14 = local_3c + uVar5;
    }
    uVar3 = (uint)uVar6;
    bVar7 = *pbVar14;
    if ((byte)(bVar7 - 0x30) < 10) {
      qVar12 = *f1;
      uVar9 = 10;
      if (10 < uVar3) {
        uVar9 = uVar3;
      }
      do {
        uVar3 = uVar9 + 1;
        if (uVar9 == (uint)uVar6) break;
        uVar3 = (uint)uVar6 + 1;
        uVar6 = (ulong)uVar3;
        qVar12 = (ulong)bVar7 + qVar12 * 10 + -0x30;
        *f1 = qVar12;
        bVar7 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
      } while ((byte)(bVar7 - 0x30) < 10);
    }
    if ((bVar7 - 9 < 5) || (bVar7 == 0x20)) {
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        uVar6 = uVar5 + 1;
      } while (pbVar14[uVar5 + 1] == 0x30);
      pbVar11 = pbVar14 + uVar6;
      bVar7 = pbVar14[uVar6];
      uVar9 = (uint)uVar5;
      if ((byte)(bVar7 - 0x30) < 10) {
        uVar8 = 5;
        if (5 < uVar9) {
          uVar8 = uVar9;
        }
        bVar2 = uVar9 < 5;
        uVar9 = uVar8 + 1;
        if (bVar2) {
          iVar13 = *f2;
          uVar10 = 5;
          if (5 < uVar5) {
            uVar10 = uVar5;
          }
          do {
            uVar5 = uVar6;
            *f2 = iVar13 * 10;
            iVar13 = (int)(char)pbVar14[uVar5] + iVar13 * 10 + -0x30;
            *f2 = iVar13;
            bVar7 = pbVar14[uVar5 + 1];
            if (9 < (byte)(bVar7 - 0x30)) {
              uVar9 = (uint)uVar5;
              break;
            }
            uVar6 = uVar5 + 1;
          } while ((int)uVar10 + 1 != (int)(uVar5 + 1));
          pbVar11 = pbVar14 + uVar5 + 1;
        }
      }
      if ((((((4 < bVar7 - 9) && (bVar7 != 0x20)) || ((pbVar11[1] | 8) != 0x6e)) ||
           ((*type = pbVar11[1], pbVar11[2] == 0 || (bVar7 = pbVar11[3], bVar7 == 0)))) ||
          ((bVar7 != 10 && (bVar7 != 0xd)))) || ((uVar3 != 10 || (uVar6 = 1, uVar9 != 5)))) {
        bVar2 = read_bad_xrefEntry(this,f1,f2,type);
        uVar6 = (ulong)bVar2;
      }
    }
    else {
      uVar6 = 0;
    }
  }
  return SUB81(uVar6,0);
}

Assistant:

bool
QPDF::read_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    std::array<char, 21> line;
    if (m->file->read(line.data(), 20) != 20) {
        // C++20: [[unlikely]]
        return false;
    }
    line[20] = '\0';
    char const* p = line.data();

    int f1_len = 0;
    int f2_len = 0;

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.

    // Gather f1 digits. NB No risk of overflow as 9'999'999'999 < max long long.
    while (*p == '0') {
        ++f1_len;
        ++p;
    }
    while (util::is_digit(*p) && f1_len++ < 10) {
        f1 *= 10;
        f1 += *p++ - '0';
    }
    // Require space
    if (!util::is_space(*p++)) {
        // Entry doesn't start with space or digit.
        // C++20: [[unlikely]]
        return false;
    }
    // Gather digits. NB No risk of overflow as 99'999 < max int.
    while (*p == '0') {
        ++f2_len;
        ++p;
    }
    while (util::is_digit(*p) && f2_len++ < 5) {
        f2 *= 10;
        f2 += static_cast<int>(*p++ - '0');
    }
    if (util::is_space(*p++) && (*p == 'f' || *p == 'n')) {
        // C++20: [[likely]]
        type = *p;
        // No test for valid line[19].
        if (*(++p) && *(++p) && (*p == '\n' || *p == '\r') && f1_len == 10 && f2_len == 5) {
            // C++20: [[likely]]
            return true;
        }
    }
    return read_bad_xrefEntry(f1, f2, type);
}